

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void __thiscall QPDF::readHPageOffset(QPDF *this,BitStream h)

{
  int iVar1;
  pointer pMVar2;
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *this_00;
  pointer pMVar3;
  int nitems;
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *entries;
  HPageOffset *t;
  QPDF *this_local;
  
  pMVar2 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  iVar1 = BitStream::getBitsInt(&h,0x20);
  (pMVar2->page_offset_hints).min_nobjects = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x20);
  (pMVar2->page_offset_hints).first_page_offset = (long)iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x10);
  (pMVar2->page_offset_hints).nbits_delta_nobjects = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x20);
  (pMVar2->page_offset_hints).min_page_length = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x10);
  (pMVar2->page_offset_hints).nbits_delta_page_length = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x20);
  (pMVar2->page_offset_hints).min_content_offset = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x10);
  (pMVar2->page_offset_hints).nbits_delta_content_offset = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x20);
  (pMVar2->page_offset_hints).min_content_length = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x10);
  (pMVar2->page_offset_hints).nbits_delta_content_length = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x10);
  (pMVar2->page_offset_hints).nbits_nshared_objects = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x10);
  (pMVar2->page_offset_hints).nbits_shared_identifier = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x10);
  (pMVar2->page_offset_hints).nbits_shared_numerator = iVar1;
  iVar1 = BitStream::getBitsInt(&h,0x10);
  (pMVar2->page_offset_hints).shared_denominator = iVar1;
  this_00 = &(pMVar2->page_offset_hints).entries;
  std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::clear(this_00);
  pMVar3 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  iVar1 = (pMVar3->linp).npages;
  load_vector_int<QPDF::HPageOffsetEntry,int>
            (&h,iVar1,this_00,(pMVar2->page_offset_hints).nbits_delta_nobjects,0);
  load_vector_int<QPDF::HPageOffsetEntry,long_long>
            (&h,iVar1,this_00,(pMVar2->page_offset_hints).nbits_delta_page_length,8);
  load_vector_int<QPDF::HPageOffsetEntry,int>
            (&h,iVar1,this_00,(pMVar2->page_offset_hints).nbits_nshared_objects,0x10);
  load_vector_vector<QPDF::HPageOffsetEntry>
            (&h,iVar1,this_00,0x10,(pMVar2->page_offset_hints).nbits_shared_identifier,0x18);
  load_vector_vector<QPDF::HPageOffsetEntry>
            (&h,iVar1,this_00,0x10,(pMVar2->page_offset_hints).nbits_shared_numerator,0x30);
  load_vector_int<QPDF::HPageOffsetEntry,long_long>
            (&h,iVar1,this_00,(pMVar2->page_offset_hints).nbits_delta_content_offset,0x48);
  load_vector_int<QPDF::HPageOffsetEntry,long_long>
            (&h,iVar1,this_00,(pMVar2->page_offset_hints).nbits_delta_content_length,0x50);
  return;
}

Assistant:

void
QPDF::readHPageOffset(BitStream h)
{
    // All comments referring to the PDF spec refer to the spec for version 1.4.

    HPageOffset& t = m->page_offset_hints;

    t.min_nobjects = h.getBitsInt(32);               // 1
    t.first_page_offset = h.getBitsInt(32);          // 2
    t.nbits_delta_nobjects = h.getBitsInt(16);       // 3
    t.min_page_length = h.getBitsInt(32);            // 4
    t.nbits_delta_page_length = h.getBitsInt(16);    // 5
    t.min_content_offset = h.getBitsInt(32);         // 6
    t.nbits_delta_content_offset = h.getBitsInt(16); // 7
    t.min_content_length = h.getBitsInt(32);         // 8
    t.nbits_delta_content_length = h.getBitsInt(16); // 9
    t.nbits_nshared_objects = h.getBitsInt(16);      // 10
    t.nbits_shared_identifier = h.getBitsInt(16);    // 11
    t.nbits_shared_numerator = h.getBitsInt(16);     // 12
    t.shared_denominator = h.getBitsInt(16);         // 13

    std::vector<HPageOffsetEntry>& entries = t.entries;
    entries.clear();
    int nitems = m->linp.npages;
    load_vector_int(h, nitems, entries, t.nbits_delta_nobjects, &HPageOffsetEntry::delta_nobjects);
    load_vector_int(
        h, nitems, entries, t.nbits_delta_page_length, &HPageOffsetEntry::delta_page_length);
    load_vector_int(
        h, nitems, entries, t.nbits_nshared_objects, &HPageOffsetEntry::nshared_objects);
    load_vector_vector(
        h,
        nitems,
        entries,
        &HPageOffsetEntry::nshared_objects,
        t.nbits_shared_identifier,
        &HPageOffsetEntry::shared_identifiers);
    load_vector_vector(
        h,
        nitems,
        entries,
        &HPageOffsetEntry::nshared_objects,
        t.nbits_shared_numerator,
        &HPageOffsetEntry::shared_numerators);
    load_vector_int(
        h, nitems, entries, t.nbits_delta_content_offset, &HPageOffsetEntry::delta_content_offset);
    load_vector_int(
        h, nitems, entries, t.nbits_delta_content_length, &HPageOffsetEntry::delta_content_length);
}